

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_30::AsyncStreamFd::getsockname
          (AsyncStreamFd *this,int __fd,sockaddr *__addr,socklen_t *__len)

{
  int iVar1;
  undefined4 in_register_00000034;
  socklen_t socklen;
  Fault f;
  socklen_t local_44;
  Fault local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_44._0_2_ = __addr->sa_family;
  local_44._2_1_ = __addr->sa_data[0];
  local_44._3_1_ = __addr->sa_data[1];
  do {
    iVar1 = ::getsockname((this->super_OwnedFileDescriptor).fd,
                          (sockaddr *)CONCAT44(in_register_00000034,__fd),&local_44);
    if (-1 < iVar1) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    __addr->sa_family = (undefined2)local_44;
    __addr->sa_data[0] = local_44._2_1_;
    __addr->sa_data[1] = local_44._3_1_;
    return local_44;
  }
  local_40.exception = (Exception *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  _::Debug::Fault::init
            (&local_40,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  _::Debug::Fault::fatal(&local_40);
}

Assistant:

void getsockname(struct sockaddr* addr, uint* length) override {
    socklen_t socklen = *length;
    KJ_SYSCALL(::getsockname(fd, addr, &socklen));
    *length = socklen;
  }